

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void mainmenu(void)

{
  WINDOW_conflict *pWVar1;
  wchar_t wVar2;
  int iVar3;
  undefined8 *puVar4;
  char **ppcVar5;
  size_t sVar6;
  int local_60;
  char local_58 [8];
  char verstr [32];
  char **nhlogo;
  char **copybanner;
  wchar_t local_18;
  int i;
  int logoheight;
  int logowidth;
  int n;
  int menuresult [1];
  
  logoheight = 1;
  puVar4 = (undefined8 *)nh_get_copyright_banner();
  sprintf(local_58,"Version %d.%d.%d",0,0,1);
  while (-1 < logoheight) {
    ppcVar5 = nhlogo_ascii;
    if (settings.graphics == 1) {
      ppcVar5 = nhlogo_unicode;
      local_60 = 0x4a;
    }
    else {
      sVar6 = strlen(nhlogo_ascii[0]);
      local_60 = (int)sVar6;
    }
    for (local_18 = L'\0'; ppcVar5[local_18] != (char *)0x0; local_18 = local_18 + L'\x01') {
    }
    wclear(basewin);
    wattr_on(basewin,0x200400,0);
    for (copybanner._4_4_ = L'\0'; copybanner._4_4_ < local_18;
        copybanner._4_4_ = copybanner._4_4_ + L'\x01') {
      wmove(basewin,copybanner._4_4_,(long)(_COLS - local_60) / 2 & 0xffffffff);
      waddnstr(basewin,ppcVar5[copybanner._4_4_],0xffffffff);
    }
    wattr_off(basewin,0x200400,0);
    iVar3 = wmove(basewin,_LINES + -4,0);
    if (iVar3 != -1) {
      waddnstr(basewin,*puVar4,0xffffffff);
    }
    iVar3 = wmove(basewin,_LINES + -3,0);
    if (iVar3 != -1) {
      waddnstr(basewin,puVar4[1],0xffffffff);
    }
    iVar3 = wmove(basewin,_LINES + -2,0);
    if (iVar3 != -1) {
      waddnstr(basewin,puVar4[2],0xffffffff);
    }
    iVar3 = wmove(basewin,_LINES + -1,0);
    if (iVar3 != -1) {
      waddnstr(basewin,puVar4[3],0xffffffff);
    }
    wVar2 = _COLS;
    pWVar1 = basewin;
    iVar3 = _LINES + -2;
    sVar6 = strlen(local_58);
    iVar3 = wmove(pWVar1,iVar3,wVar2 - (int)sVar6);
    if (iVar3 != -1) {
      waddnstr(basewin,local_58,0xffffffff);
    }
    wrefresh(basewin);
    logoheight = curses_display_menu_core
                           ((nh_menuitem_conflict *)mainmenu_items,L'\a',(char *)0x0,L'\x01',
                            &logowidth,L'\0',local_18,_COLS,L'\x18',
                            (_func_nh_bool_win_menu_ptr_wchar_t *)0x0,'\0');
    if (L'\0' < logoheight) {
      switch(logowidth) {
      case 1:
        rungame('\0');
        break;
      case 2:
        rungame('\x01');
        break;
      case 3:
        loadgame();
        break;
      case 4:
        replay();
        break;
      case 5:
        display_options('\x01');
        break;
      case 6:
        show_topten((char *)0x0,-1,0,'\0');
        break;
      case 8:
        return;
      }
    }
  }
  return;
}

Assistant:

static void mainmenu(void)
{
    int menuresult[1];
    int n = 1, logowidth, logoheight, i;
    const char * const *copybanner = nh_get_copyright_banner();
    const char * const *nhlogo;
    char verstr[32];
    sprintf(verstr, "Version %d.%d.%d", VERSION_MAJOR, VERSION_MINOR, PATCHLEVEL);

    while (n >= 0) {
        nhlogo = (settings.graphics == UNICODE_GRAPHICS) ? nhlogo_unicode : nhlogo_ascii;

        /* strlen doesn't work because there's unicode. */
        logowidth = (settings.graphics == UNICODE_GRAPHICS) ? 74 : strlen(nhlogo_ascii[0]);

        for (logoheight = 0; nhlogo[logoheight]; logoheight++)
            /* empty */;
        wclear(basewin);
        wattron(basewin, A_BOLD | COLOR_PAIR(4));
        for (i = 0; i < logoheight; i++) {
            wmove(basewin, i, (COLS - logowidth) / 2);
            waddstr(basewin, nhlogo[i]);
        }
        wattroff(basewin, A_BOLD | COLOR_PAIR(4));
        mvwaddstr(basewin, LINES-4, 0, copybanner[0]);
        mvwaddstr(basewin, LINES-3, 0, copybanner[1]);
        mvwaddstr(basewin, LINES-2, 0, copybanner[2]);
        mvwaddstr(basewin, LINES-1, 0, copybanner[3]);
        mvwaddstr(basewin, LINES-2, COLS - strlen(verstr), verstr);
        wrefresh(basewin);

        n = curses_display_menu_core(mainmenu_items, ARRAY_SIZE(mainmenu_items),
                NULL, PICK_ONE, menuresult, 0, logoheight,
                COLS, ROWNO+3, NULL, FALSE);
        if (n < 1)
            continue;

        switch (menuresult[0]) {
            case NEWGAME:
                rungame(FALSE);
                break;

            case TUTORIAL:
                rungame(TRUE);
                break;

            case LOAD:
                loadgame();
                break;

            case REPLAY:
                replay();
                break;

            case OPTIONS:
                display_options(TRUE);
                break;

#if defined(NETCLIENT)
            case NETWORK:
                netgame();
                break;
#endif

            case TOPTEN:
                show_topten(NULL, -1, FALSE, FALSE);
                break;

            case EXITGAME:
                n = -1; /* simulate menu cancel */
                return;
        }
    }
}